

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_hotspot.cxx
# Opt level: O1

void __thiscall Fl_Window::hotspot(Fl_Window *this,int X,int Y,int offscreen)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int scr_y;
  int scr_h;
  int scr_w;
  int scr_x;
  int my;
  int mx;
  int y;
  int x;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  Fl::get_mouse(&local_3c,&local_40);
  uVar7 = local_3c - X;
  uVar5 = local_40 - Y;
  if (offscreen == 0) {
    Fl::get_mouse(&local_34,&local_38);
    Fl::screen_work_area(&local_44,&local_50,&local_48,&local_4c,local_34,local_38);
    uVar3 = (this->super_Fl_Group).super_Fl_Widget.flags_ & 8;
    iVar2 = 0x14;
    if (uVar3 != 0) {
      iVar2 = 0;
    }
    uVar4 = uVar3 >> 1 ^ 4;
    iVar6 = (this->super_Fl_Group).super_Fl_Widget.w_ + uVar4;
    uVar1 = (local_48 + local_44) - iVar6;
    if ((int)(iVar6 + uVar7) <= local_48 + local_44) {
      uVar1 = uVar7;
    }
    uVar7 = uVar4 + local_44;
    if (local_44 <= (int)(uVar1 - uVar4)) {
      uVar7 = uVar1;
    }
    iVar6 = (uVar3 ^ 8) + (this->super_Fl_Group).super_Fl_Widget.h_;
    uVar3 = (local_4c + local_50) - iVar6;
    if ((int)(iVar6 + uVar5) <= local_4c + local_50) {
      uVar3 = uVar5;
    }
    uVar5 = iVar2 + local_50;
    if (local_50 <= (int)(uVar3 - iVar2)) {
      uVar5 = uVar3;
    }
    if (uVar7 == (this->super_Fl_Group).super_Fl_Widget.x_) {
      (this->super_Fl_Group).super_Fl_Widget.x_ = uVar7 - 1;
    }
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (this,(ulong)uVar7,(ulong)uVar5,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
  return;
}

Assistant:

void Fl_Window::hotspot(int X, int Y, int offscreen) {
  int mx,my;

  // Update the screen position based on the mouse position.
  Fl::get_mouse(mx,my);
  X = mx-X; Y = my-Y;

  // If offscreen is 0 (the default), make sure that the window
  // stays on the screen, if possible.
  if (!offscreen) {
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_work_area(scr_x, scr_y, scr_w, scr_h);

    int top = 0;
    int left = 0;
    int right = 0;
    int bottom = 0;

    if (border()) {
#ifdef WIN32
      if (size_range_set && (maxw != minw || maxh != minh)) {
        left = right = GetSystemMetrics(SM_CXSIZEFRAME);
        top = bottom = GetSystemMetrics(SM_CYSIZEFRAME);
      } else {
        left = right = GetSystemMetrics(SM_CXFIXEDFRAME); 
        top = bottom = GetSystemMetrics(SM_CYFIXEDFRAME);
      }
      top += GetSystemMetrics(SM_CYCAPTION);
#elif defined(__APPLE__)
      top = 24;
      left = 2;
      right = 2;
      bottom = 2;
#else
      // Ensure border is on screen; these values are generic enough
      // to work with many window managers, and are based on KDE defaults.
      top = 20;
      left = 4;
      right = 4;
      bottom = 8;
#endif
    }
    // now insure contents are on-screen (more important than border):
    if (X+w()+right > scr_w+scr_x) X = scr_w+scr_x-right-w();
    if (X-left < scr_x) X = left + scr_x;
    if (Y+h()+bottom > scr_h+scr_y) Y = scr_h+scr_y-bottom-h();
    if (Y-top < scr_y) Y = top + scr_y;
    // make sure that we will force this position
    if (X==x()) x(X-1);
  }

  position(X,Y);
}